

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats_recorder.cpp
# Opt level: O3

int __thiscall RunStatsRecorder::append_to(RunStatsRecorder *this,CSVStringTable *st)

{
  uint uVar1;
  uint uVar2;
  pointer ppRVar3;
  
  uVar1 = CSVTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::addRows(st,1);
  ppRVar3 = (this->stat_items).super__Vector_base<RunStat_*,_std::allocator<RunStat_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while ((uVar2 = uVar1,
         ppRVar3 !=
         (this->stat_items).super__Vector_base<RunStat_*,_std::allocator<RunStat_*>_>._M_impl.
         super__Vector_impl_data._M_finish &&
         (uVar2 = (*(*ppRVar3)->_vptr_RunStat[5])(*ppRVar3,st,(ulong)uVar1), uVar2 == 0))) {
    ppRVar3 = ppRVar3 + 1;
  }
  return uVar2;
}

Assistant:

int RunStatsRecorder::append_to(CSVStringTable& st) const{
  int ret;
  unsigned new_row = st.addRows(1);

  if ((ret = update_row(st, new_row)))
    return ret;
  else
    return new_row;
}